

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Device.cxx
# Opt level: O0

Fl_Display_Device * Fl_Display_Device::display_device(void)

{
  int iVar1;
  Fl_Display_Device *this;
  Fl_Graphics_Driver *graphics_driver;
  
  if (display_device()::display == '\0') {
    iVar1 = __cxa_guard_acquire(&display_device()::display);
    if (iVar1 != 0) {
      this = (Fl_Display_Device *)operator_new(0x10);
      graphics_driver = (Fl_Graphics_Driver *)operator_new(0x6d0);
      Fl_Xlib_Graphics_Driver::Fl_Xlib_Graphics_Driver((Fl_Xlib_Graphics_Driver *)graphics_driver);
      Fl_Display_Device(this,graphics_driver);
      display_device::display = this;
      __cxa_guard_release(&display_device()::display);
    }
  }
  return display_device::display;
}

Assistant:

Fl_Display_Device *Fl_Display_Device::display_device() {
  static Fl_Display_Device *display = new Fl_Display_Device(new
#if defined(__APPLE__)
                                                                  Fl_Quartz_Graphics_Driver
#elif defined(WIN32)
                                                                  Fl_GDI_Graphics_Driver
#else
                                                                  Fl_Xlib_Graphics_Driver
#endif
                                                                 );
  return display;
}